

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

cmArgumentParser<cmCoreTryCompile::Arguments> *
anon_unknown.dwarf_10dc128::makeTryRunParser
          (cmArgumentParser<cmCoreTryCompile::Arguments> *__return_storage_ptr__,
          cmArgumentParser<cmCoreTryCompile::Arguments> *base)

{
  cmArgumentParser<cmCoreTryCompile::Arguments> *pcVar1;
  static_string_view sVar2;
  cmArgumentParser<cmCoreTryCompile::Arguments> local_88;
  cmArgumentParser<cmCoreTryCompile::Arguments> *local_18;
  cmArgumentParser<cmCoreTryCompile::Arguments> *base_local;
  
  local_18 = base;
  base_local = __return_storage_ptr__;
  cmArgumentParser<cmCoreTryCompile::Arguments>::cmArgumentParser(&local_88,base);
  sVar2 = ::cm::operator____s("COMPILE_OUTPUT_VARIABLE",0x17);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (&local_88,sVar2,0x2b0);
  sVar2 = ::cm::operator____s("RUN_OUTPUT_VARIABLE",0x13);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,sVar2,0x2d8);
  sVar2 = ::cm::operator____s("RUN_OUTPUT_STDOUT_VARIABLE",0x1a);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,sVar2,0x300);
  sVar2 = ::cm::operator____s("RUN_OUTPUT_STDERR_VARIABLE",0x1a);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,sVar2,0x328);
  sVar2 = ::cm::operator____s("WORKING_DIRECTORY",0x11);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,sVar2,0x350);
  sVar2 = ::cm::operator____s("ARGS",4);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::
           Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar1,sVar2,0x378);
  cmArgumentParser<cmCoreTryCompile::Arguments>::cmArgumentParser(__return_storage_ptr__,pcVar1);
  cmArgumentParser<cmCoreTryCompile::Arguments>::~cmArgumentParser(&local_88);
  return __return_storage_ptr__;
}

Assistant:

cmArgumentParser<Arguments> makeTryRunParser(
  const cmArgumentParser<Arguments>& base)
{
  return cmArgumentParser<Arguments>{ base }
    .Bind("COMPILE_OUTPUT_VARIABLE"_s, &Arguments::CompileOutputVariable)
    .Bind("RUN_OUTPUT_VARIABLE"_s, &Arguments::RunOutputVariable)
    .Bind("RUN_OUTPUT_STDOUT_VARIABLE"_s, &Arguments::RunOutputStdOutVariable)
    .Bind("RUN_OUTPUT_STDERR_VARIABLE"_s, &Arguments::RunOutputStdErrVariable)
    .Bind("WORKING_DIRECTORY"_s, &Arguments::RunWorkingDirectory)
    .Bind("ARGS"_s, &Arguments::RunArgs)
    /* keep semicolon on own line */;
}